

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

void fill_variance_tree(void *data,BLOCK_SIZE bsize)

{
  VPVariance *r;
  VPartVar *a;
  VPartVar *a_00;
  VPartVar *b;
  VPartVar *b_00;
  variance_node node;
  variance_node local_58;
  
  local_58.split[1] = (VPartVar *)0x0;
  local_58.split[2] = (VPartVar *)0x0;
  local_58.part_variances = (VPVariance *)0x0;
  local_58.split[0] = (VPartVar *)0x0;
  local_58.split[3] = (VPartVar *)0x0;
  tree_to_node(data,bsize,&local_58);
  a_00 = local_58.split[1];
  a = local_58.split[0];
  r = local_58.part_variances;
  sum_2_variances(local_58.split[0],local_58.split[1],(local_58.part_variances)->horz);
  b_00 = local_58.split[3];
  b = local_58.split[2];
  sum_2_variances(local_58.split[2],local_58.split[3],r->horz + 1);
  sum_2_variances(a,b,r->vert);
  sum_2_variances(a_00,b_00,r->vert + 1);
  sum_2_variances(r->vert,r->vert + 1,&r->none);
  return;
}

Assistant:

static inline void fill_variance_tree(void *data, BLOCK_SIZE bsize) {
  variance_node node;
  memset(&node, 0, sizeof(node));
  tree_to_node(data, bsize, &node);
  sum_2_variances(node.split[0], node.split[1], &node.part_variances->horz[0]);
  sum_2_variances(node.split[2], node.split[3], &node.part_variances->horz[1]);
  sum_2_variances(node.split[0], node.split[2], &node.part_variances->vert[0]);
  sum_2_variances(node.split[1], node.split[3], &node.part_variances->vert[1]);
  sum_2_variances(&node.part_variances->vert[0], &node.part_variances->vert[1],
                  &node.part_variances->none);
}